

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_RoundTrip.c
# Opt level: O0

_Bool CompareStructType(StructType *struct1,StructType *struct2)

{
  _Bool _Var1;
  ulong local_28;
  size_t i;
  _Bool same;
  StructType *struct2_local;
  StructType *struct1_local;
  
  i._7_1_ = CompareSubStructType(&struct1->subStruct,&struct2->subStruct);
  if (struct1->subStructArrayCount != struct2->subStructArrayCount) {
    i._7_1_ = false;
  }
  if (struct1->subStructArrayCount == struct2->subStructArrayCount) {
    for (local_28 = 0; local_28 < struct1->subStructArrayCount; local_28 = local_28 + 1) {
      _Var1 = CompareSubStructType
                        (struct1->subStructArray + local_28,struct2->subStructArray + local_28);
      if (!_Var1) {
        return false;
      }
    }
  }
  return i._7_1_;
}

Assistant:

static
bool
    CompareStructType
    (
        StructType const*       struct1,
        StructType const*       struct2
    )
{
    bool same = true;

    if( !CompareSubStructType( &struct1->subStruct, &struct2->subStruct ) ) { same = false; }
    if( struct1->subStructArrayCount != struct2->subStructArrayCount ) { same = false; }
    if( struct1->subStructArrayCount == struct2->subStructArrayCount )
    {
        for( size_t i=0; i<struct1->subStructArrayCount; i++ )
        {
            if( !CompareSubStructType( &struct1->subStructArray[i], &struct2->subStructArray[i] ) ) { same = false; break; }
        }
    }

    return same;
}